

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBControlTransfers.cpp
# Opt level: O3

void __thiscall
USBControlTransferParser::ParseDataPacket(USBControlTransferParser *this,USBPacket *packet)

{
  undefined1 uVar1;
  byte bVar2;
  uint uVar3;
  USBAnalyzerResults *pUVar4;
  bool bVar5;
  int iVar6;
  mapped_type *pmVar7;
  ostream *poVar8;
  USBDescriptorType UVar9;
  int offset;
  Frame aFStack_58 [40];
  
  this->pPacket = packet;
  this->mPacketOffset = 0;
  iVar6 = (*(int *)&(packet->mData).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
          *(int *)&(packet->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ._M_impl.super__Vector_impl_data._M_start) + -4;
  this->mPacketDataBytes = iVar6;
  if ((((this->mRequest).bmRequestType & 0x60) == 0) && ((this->mRequest).bRequest == '\x06')) {
    uVar3 = *(uint *)&(this->mRequest).wValue;
    if ((uVar3 - 0x100 & 0xffff) < 0x800) {
      if (0 < iVar6) {
        do {
          pmVar7 = std::
                   map<unsigned_char,_USBClassCodes,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_USBClassCodes>_>_>
                   ::operator[](&this->mInterfaceClasses,&this->mInterfaceNumber);
          iVar6 = this->mParsedOffset;
          offset = (int)packet;
          if (iVar6 == 0) {
            pUVar4 = this->pResults;
            USBPacket::GetDataPayloadField
                      ((USBPacket *)aFStack_58,offset,this->mPacketOffset,'\x01',
                       (char *)(ulong)this->mAddress,0x13cb7b,'\0');
            AnalyzerResults::AddFrame((Frame *)pUVar4);
            Frame::~Frame(aFStack_58);
            iVar6 = this->mPacketOffset;
            this->mDescBytes =
                 (uint)(packet->mData).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start[(long)iVar6 + 2];
LAB_0013556a:
            iVar6 = iVar6 + 1;
            this->mPacketOffset = iVar6;
            this->mParsedOffset = this->mParsedOffset + 1;
          }
          else {
            uVar1 = (undefined1)*pmVar7;
            if (iVar6 == 1) {
              iVar6 = this->mPacketOffset;
              bVar2 = (packet->mData).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)iVar6 + 2];
              this->mDescType = (uint)bVar2;
              pUVar4 = this->pResults;
              if ((((byte)(bVar2 - 1) < 8) ||
                  ((uVar1 & CC_ApplicationSpecific) == CC_CommunicationsAndCDCControl)) ||
                 (uVar1 == CC_CDCData)) {
                USBPacket::GetDataPayloadField
                          ((USBPacket *)aFStack_58,offset,iVar6,'\x01',(char *)(ulong)this->mAddress
                           ,0x13c524,'\x0f');
                AnalyzerResults::AddFrame((Frame *)pUVar4);
              }
              else {
                USBPacket::GetDataPayloadField
                          ((USBPacket *)aFStack_58,offset,iVar6,'\x01',(char *)(ulong)this->mAddress
                           ,0x13c524,'\x10');
                AnalyzerResults::AddFrame((Frame *)pUVar4);
              }
LAB_0013555d:
              Frame::~Frame(aFStack_58);
              iVar6 = this->mPacketOffset;
              goto LAB_0013556a;
            }
            if (iVar6 == 2) {
              UVar9 = this->mDescType;
              if ((UVar9 & ~DT_DEVICE) == DT_CDC_CS_INTERFACE &&
                  (uVar1 & (CC_WirelessController|CC_AudioVideo|CC_Printer)) ==
                  CC_CommunicationsAndCDCControl) {
                this->mDescSubtype =
                     (uint)(packet->mData).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start[(long)this->mPacketOffset + 2];
                pUVar4 = this->pResults;
                USBPacket::GetDataPayloadField
                          ((USBPacket *)aFStack_58,offset,this->mPacketOffset,'\x01',
                           (char *)(ulong)this->mAddress,0x13c546,'\x1f');
                AnalyzerResults::AddFrame((Frame *)pUVar4);
                goto LAB_0013555d;
              }
            }
            else {
              UVar9 = this->mDescType;
            }
            if (UVar9 == DT_STRING) {
              bVar5 = ParseStringDescriptor(this);
              iVar6 = this->mPacketOffset;
              if ((bVar5) && (iVar6 < this->mPacketDataBytes)) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "String descriptor length shorter than packet length. Packet length: ",
                           0x44);
                poVar8 = (ostream *)
                         std::ostream::operator<<((ostream *)&std::cerr,this->mPacketDataBytes);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8," processed bytes: ",0x12)
                ;
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->mPacketOffset);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar8," reported descriptor length: ",0x1d);
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->mDescBytes);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
                return;
              }
            }
            else {
              ParseStandardDescriptor(this);
              iVar6 = this->mPacketOffset;
            }
          }
        } while (iVar6 < this->mPacketDataBytes);
      }
      return;
    }
    if ((uVar3 & 0xff00) == 0x2200) {
      ParseHIDReportDescriptor(this);
      return;
    }
  }
  bVar5 = IsCDCClassRequest(this);
  if (!bVar5) {
    ParseUnknownResponse(this);
    return;
  }
  ParseCDCDataStage(this);
  return;
}

Assistant:

void USBControlTransferParser::ParseDataPacket( USBPacket& packet )
{
    pPacket = &packet;
    mPacketOffset = 0;
    mPacketDataBytes = packet.mData.size() - 4;

    if( mRequest.IsRequestedStandardDescriptor() )
    {
        while( mPacketDataBytes > mPacketOffset )
        {
            U8 interfaceClass = mInterfaceClasses[ mInterfaceNumber ];

            if( mParsedOffset == 0 ) // are we just starting with this descriptor?
            {
                // handle the bLength field
                pResults->AddFrame( packet.GetDataPayloadField( mPacketOffset, 1, mAddress, "bLength", Fld_None, FF_DataDescriptor ) );
                mDescBytes = packet.GetDataPayload( mPacketOffset, 1 );
                ++mPacketOffset;
                ++mParsedOffset;
            }
            else if( mParsedOffset == 1 )
            {
                mDescType = USBDescriptorType( packet.GetDataPayload( mPacketOffset, 1 ) );

                if( IsStandardDescriptor( mDescType ) || interfaceClass == CC_HID || interfaceClass == CC_CommunicationsAndCDCControl ||
                    interfaceClass == CC_CDCData )
                    pResults->AddFrame( packet.GetDataPayloadField( mPacketOffset, 1, mAddress, "bDescriptorType", Fld_bDescriptorType ) );
                else
                    pResults->AddFrame(
                        packet.GetDataPayloadField( mPacketOffset, 1, mAddress, "bDescriptorType", Fld_bDescriptorType_Other ) );

                ++mPacketOffset;
                ++mParsedOffset;
            }
            else if( mParsedOffset == 2 && ( interfaceClass == CC_CommunicationsAndCDCControl || interfaceClass == CC_CDCData ) &&
                     ( mDescType == DT_CDC_CS_INTERFACE || mDescType == DT_CDC_CS_ENDPOINT ) )
            {
                mDescSubtype = USBCDCDescriptorSubtype( packet.GetDataPayload( mPacketOffset, 1 ) );
                pResults->AddFrame(
                    packet.GetDataPayloadField( mPacketOffset, 1, mAddress, "bDescriptorSubtype", Fld_CDC_DescriptorSubtype ) );

                ++mPacketOffset;
                ++mParsedOffset;
            }
            else
            {
                if( mDescType == DT_STRING )
                {
                    bool detected_complete_descriptor = ParseStringDescriptor();
                    if( detected_complete_descriptor && mPacketDataBytes > mPacketOffset )
                    {
                        // we finished parsing the complete string descriptor, according to bLength, however there are still bytes left in
                        // the packet.
                        std::cerr << "String descriptor length shorter than packet length. Packet length: " << mPacketDataBytes
                                  << " processed bytes: " << mPacketOffset << " reported descriptor length: " << mDescBytes << "\n";
                        break;
                    }
                }
                else
                {
                    ParseStandardDescriptor();
                }
            }
        }
    }
    else if( mRequest.IsRequestedHIDReportDescriptor() )
    {
        ParseHIDReportDescriptor();
    }
    else if( IsCDCClassRequest() )
    {
        ParseCDCDataStage();
    }
    else
    {
        ParseUnknownResponse();
    }
}